

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O2

lzma_ret validate_chain(lzma_filter *filters,size_t *count)

{
  lzma_ret lVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  lzma_vli lVar5;
  long lVar6;
  
  lVar1 = LZMA_PROG_ERROR;
  if ((filters != (lzma_filter *)0x0) && (lVar5 = filters->id, lVar5 != 0xffffffffffffffff)) {
    bVar4 = 1;
    uVar2 = 0;
    lVar1 = LZMA_OPTIONS_ERROR;
    uVar3 = 0;
    do {
      lVar6 = 0;
      while (lVar5 != *(lzma_vli *)((long)&features[0].id + lVar6)) {
        lVar6 = lVar6 + 0x18;
        if (lVar6 == 0xf0) {
          return LZMA_OPTIONS_ERROR;
        }
      }
      if ((bVar4 & 1) == 0) {
        return LZMA_OPTIONS_ERROR;
      }
      bVar4 = (&features[0].non_last_ok)[lVar6];
      uVar2 = uVar2 + (&features[0].changes_size)[lVar6];
      uVar3 = uVar3 + 1;
      lVar5 = filters[uVar3].id;
    } while (lVar5 != 0xffffffffffffffff);
    if (((uVar3 < 5) && ((&features[0].last_ok)[lVar6] != false)) && (uVar2 < 4)) {
      *count = uVar3;
      lVar1 = LZMA_OK;
    }
  }
  return lVar1;
}

Assistant:

static lzma_ret
validate_chain(const lzma_filter *filters, size_t *count)
{
	// There must be at least one filter.
	if (filters == NULL || filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_PROG_ERROR;

	// Number of non-last filters that may change the size of the data
	// significantly (that is, more than 1-2 % or so).
	size_t changes_size_count = 0;

	// True if it is OK to add a new filter after the current filter.
	bool non_last_ok = true;

	// True if the last filter in the given chain is actually usable as
	// the last filter. Only filters that support embedding End of Payload
	// Marker can be used as the last filter in the chain.
	bool last_ok = false;

	size_t i = 0;
	do {
		size_t j;
		for (j = 0; filters[i].id != features[j].id; ++j)
			if (features[j].id == LZMA_VLI_UNKNOWN)
				return LZMA_OPTIONS_ERROR;

		// If the previous filter in the chain cannot be a non-last
		// filter, the chain is invalid.
		if (!non_last_ok)
			return LZMA_OPTIONS_ERROR;

		non_last_ok = features[j].non_last_ok;
		last_ok = features[j].last_ok;
		changes_size_count += features[j].changes_size;

	} while (filters[++i].id != LZMA_VLI_UNKNOWN);

	// There must be 1-4 filters. The last filter must be usable as
	// the last filter in the chain. A maximum of three filters are
	// allowed to change the size of the data.
	if (i > LZMA_FILTERS_MAX || !last_ok || changes_size_count > 3)
		return LZMA_OPTIONS_ERROR;

	*count = i;
	return LZMA_OK;
}